

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

size_t HUF_decompress4X1_usingDTable_internal_fast
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 HUF_DecompressFastLoopFn loopFn)

{
  BYTE *pBVar1;
  uint uVar2;
  BYTE *pBVar3;
  ulong uVar4;
  size_t sVar5;
  bool bVar6;
  size_t err_code_1;
  BIT_DStream_t bit;
  BYTE *pBStack_2d0;
  int i;
  BYTE *segmentEnd;
  size_t segmentSize;
  size_t err_code;
  size_t ret;
  HUF_DecompressFastArgs args;
  BYTE *oend;
  BYTE *iend;
  void *dt;
  HUF_DecompressFastLoopFn loopFn_local;
  HUF_DTable *DTable_local;
  size_t cSrcSize_local;
  void *cSrc_local;
  size_t dstSize_local;
  void *dst_local;
  BYTE *pStart;
  BYTE *local_1a0;
  BIT_DStream_status local_198;
  uint local_194;
  BIT_DStream_status result_2;
  U32 nbBytes_2;
  BIT_DStream_status local_184;
  uint local_17c;
  BIT_DStream_status result_1;
  U32 nbBytes_1;
  BIT_DStream_status local_168;
  uint local_164;
  BIT_DStream_status result;
  U32 nbBytes;
  BIT_DStream_status local_158;
  BYTE c;
  size_t val;
  BYTE c_2;
  size_t val_2;
  BYTE c_3;
  size_t val_3;
  BYTE c_1;
  size_t val_1;
  BYTE c_4;
  size_t val_4;
  BYTE c_5;
  size_t val_5;
  
  pBVar3 = (BYTE *)((long)cSrc + 6);
  args.iend[3] = (BYTE *)((long)dst + dstSize);
  dst_local = (void *)HUF_DecompressFastArgs_init
                                ((HUF_DecompressFastArgs *)&ret,dst,dstSize,cSrc,cSrcSize,DTable);
  uVar2 = ERR_isError((size_t)dst_local);
  if (uVar2 == 0) {
    if (dst_local == (void *)0x0) {
      dst_local = (void *)0x0;
    }
    else {
      if (ret < args.dt) {
        __assert_fail("args.ip[0] >= args.ilimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x329,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      (*loopFn)((HUF_DecompressFastArgs *)&ret);
      if (ret < pBVar3) {
        __assert_fail("args.ip[0] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x32f,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (args.ip[0] < pBVar3) {
        __assert_fail("args.ip[1] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x330,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (args.ip[1] < pBVar3) {
        __assert_fail("args.ip[2] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x331,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (args.ip[2] < pBVar3) {
        __assert_fail("args.ip[3] >= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x332,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      if (args.iend[3] < args.op[2]) {
        __assert_fail("args.op[3] <= oend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x333,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
      uVar4 = dstSize + 3 >> 2;
      pBStack_2d0 = (BYTE *)dst;
      for (bit.limitPtr._4_4_ = 0; bit.limitPtr._4_4_ < 4;
          bit.limitPtr._4_4_ = bit.limitPtr._4_4_ + 1) {
        if ((ulong)((long)args.iend[3] - (long)pBStack_2d0) < uVar4) {
          pBStack_2d0 = args.iend[3];
        }
        else {
          pBStack_2d0 = pBStack_2d0 + uVar4;
        }
        sVar5 = HUF_initRemainingDStream
                          ((BIT_DStream_t *)&err_code_1,(HUF_DecompressFastArgs *)&ret,
                           bit.limitPtr._4_4_,pBStack_2d0);
        uVar2 = ERR_isError(sVar5);
        if (uVar2 != 0) {
          return sVar5;
        }
        pBVar3 = args.ip[(long)bit.limitPtr._4_4_ + 3];
        local_1a0 = pBVar3;
        if ((long)pBStack_2d0 - (long)pBVar3 < 4) {
          if ((uint)bit.bitContainer < 0x41) {
            if ((ulong)bit._8_8_ < bit.start) {
              if ((char *)bit._8_8_ != bit.ptr) {
                local_17c = (uint)bit.bitContainer >> 3;
                if ((char *)(bit._8_8_ - (ulong)local_17c) < bit.ptr) {
                  local_17c = bit.bitsConsumed - (int)bit.ptr;
                }
                bit._8_8_ = bit._8_8_ - (ulong)local_17c;
                bit.bitContainer._0_4_ = (uint)bit.bitContainer + local_17c * -8;
                err_code_1 = MEM_readLEST((void *)bit._8_8_);
              }
            }
            else {
              BIT_reloadDStreamFast((BIT_DStream_t *)&err_code_1);
            }
          }
        }
        else {
          while( true ) {
            if ((uint)bit.bitContainer < 0x41) {
              if ((ulong)bit._8_8_ < bit.start) {
                if ((char *)bit._8_8_ == bit.ptr) {
                  if ((uint)bit.bitContainer < 0x40) {
                    local_158 = BIT_DStream_endOfBuffer;
                  }
                  else {
                    local_158 = BIT_DStream_completed;
                  }
                }
                else {
                  local_164 = (uint)bit.bitContainer >> 3;
                  bVar6 = (char *)(bit._8_8_ - (ulong)local_164) < bit.ptr;
                  if (bVar6) {
                    local_164 = bit.bitsConsumed - (int)bit.ptr;
                  }
                  local_168 = (BIT_DStream_status)bVar6;
                  bit._8_8_ = bit._8_8_ - (ulong)local_164;
                  bit.bitContainer._0_4_ = (uint)bit.bitContainer + local_164 * -8;
                  err_code_1 = MEM_readLEST((void *)bit._8_8_);
                  local_158 = local_168;
                }
              }
              else {
                local_158 = BIT_reloadDStreamFast((BIT_DStream_t *)&err_code_1);
              }
            }
            else {
              local_158 = BIT_DStream_overflow;
            }
            if (local_158 != BIT_DStream_unfinished || pBStack_2d0 + -3 <= local_1a0) break;
            uVar2 = MEM_64bits();
            if (uVar2 != 0) {
              sVar5 = BIT_lookBitsFast((BIT_DStream_t *)&err_code_1,0xb);
              bit.bitContainer._0_4_ =
                   *(byte *)((long)DTable + sVar5 * 2 + 4) + (uint)bit.bitContainer;
              *local_1a0 = *(BYTE *)((long)DTable + sVar5 * 2 + 5);
              local_1a0 = local_1a0 + 1;
            }
            MEM_64bits();
            sVar5 = BIT_lookBitsFast((BIT_DStream_t *)&err_code_1,0xb);
            bit.bitContainer._0_4_ =
                 *(byte *)((long)DTable + sVar5 * 2 + 4) + (uint)bit.bitContainer;
            *local_1a0 = *(BYTE *)((long)DTable + sVar5 * 2 + 5);
            uVar2 = MEM_64bits();
            pBVar1 = local_1a0 + 1;
            if (uVar2 != 0) {
              sVar5 = BIT_lookBitsFast((BIT_DStream_t *)&err_code_1,0xb);
              bit.bitContainer._0_4_ =
                   *(byte *)((long)DTable + sVar5 * 2 + 4) + (uint)bit.bitContainer;
              local_1a0[1] = *(BYTE *)((long)DTable + sVar5 * 2 + 5);
              pBVar1 = local_1a0 + 2;
            }
            local_1a0 = pBVar1;
            sVar5 = BIT_lookBitsFast((BIT_DStream_t *)&err_code_1,0xb);
            bit.bitContainer._0_4_ =
                 *(byte *)((long)DTable + sVar5 * 2 + 4) + (uint)bit.bitContainer;
            *local_1a0 = *(BYTE *)((long)DTable + sVar5 * 2 + 5);
            local_1a0 = local_1a0 + 1;
          }
        }
        uVar2 = MEM_32bits();
        if (uVar2 != 0) {
          while( true ) {
            if ((uint)bit.bitContainer < 0x41) {
              if ((ulong)bit._8_8_ < bit.start) {
                if ((char *)bit._8_8_ == bit.ptr) {
                  if ((uint)bit.bitContainer < 0x40) {
                    local_184 = BIT_DStream_endOfBuffer;
                  }
                  else {
                    local_184 = BIT_DStream_completed;
                  }
                }
                else {
                  local_194 = (uint)bit.bitContainer >> 3;
                  bVar6 = (char *)(bit._8_8_ - (ulong)local_194) < bit.ptr;
                  if (bVar6) {
                    local_194 = bit.bitsConsumed - (int)bit.ptr;
                  }
                  local_198 = (BIT_DStream_status)bVar6;
                  bit._8_8_ = bit._8_8_ - (ulong)local_194;
                  bit.bitContainer._0_4_ = (uint)bit.bitContainer + local_194 * -8;
                  err_code_1 = MEM_readLEST((void *)bit._8_8_);
                  local_184 = local_198;
                }
              }
              else {
                local_184 = BIT_reloadDStreamFast((BIT_DStream_t *)&err_code_1);
              }
            }
            else {
              local_184 = BIT_DStream_overflow;
            }
            if (local_184 != BIT_DStream_unfinished || pBStack_2d0 <= local_1a0) break;
            sVar5 = BIT_lookBitsFast((BIT_DStream_t *)&err_code_1,0xb);
            bit.bitContainer._0_4_ =
                 *(byte *)((long)DTable + sVar5 * 2 + 4) + (uint)bit.bitContainer;
            *local_1a0 = *(BYTE *)((long)DTable + sVar5 * 2 + 5);
            local_1a0 = local_1a0 + 1;
          }
        }
        while (local_1a0 < pBStack_2d0) {
          sVar5 = BIT_lookBitsFast((BIT_DStream_t *)&err_code_1,0xb);
          bit.bitContainer._0_4_ = *(byte *)((long)DTable + sVar5 * 2 + 4) + (uint)bit.bitContainer;
          *local_1a0 = *(BYTE *)((long)DTable + sVar5 * 2 + 5);
          local_1a0 = local_1a0 + 1;
        }
        args.ip[(long)bit.limitPtr._4_4_ + 3] =
             pBStack_2d0 + ((long)args.ip[(long)bit.limitPtr._4_4_ + 3] - (long)pBVar3);
        if (args.ip[(long)bit.limitPtr._4_4_ + 3] != pBStack_2d0) {
          return 0xffffffffffffffec;
        }
      }
      dst_local = (void *)dstSize;
      if (dstSize == 0) {
        __assert_fail("dstSize != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x348,
                      "size_t HUF_decompress4X1_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                     );
      }
    }
  }
  return (size_t)dst_local;
}

Assistant:

static HUF_FAST_BMI2_ATTRS
size_t
HUF_decompress4X1_usingDTable_internal_fast(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable,
    HUF_DecompressFastLoopFn loopFn)
{
    void const* dt = DTable + 1;
    const BYTE* const iend = (const BYTE*)cSrc + 6;
    BYTE* const oend = (BYTE*)dst + dstSize;
    HUF_DecompressFastArgs args;
    {   size_t const ret = HUF_DecompressFastArgs_init(&args, dst, dstSize, cSrc, cSrcSize, DTable);
        FORWARD_IF_ERROR(ret, "Failed to init fast loop args");
        if (ret == 0)
            return 0;
    }

    assert(args.ip[0] >= args.ilimit);
    loopFn(&args);

    /* Our loop guarantees that ip[] >= ilimit and that we haven't
    * overwritten any op[].
    */
    assert(args.ip[0] >= iend);
    assert(args.ip[1] >= iend);
    assert(args.ip[2] >= iend);
    assert(args.ip[3] >= iend);
    assert(args.op[3] <= oend);
    (void)iend;

    /* finish bit streams one by one. */
    {   size_t const segmentSize = (dstSize+3) / 4;
        BYTE* segmentEnd = (BYTE*)dst;
        int i;
        for (i = 0; i < 4; ++i) {
            BIT_DStream_t bit;
            if (segmentSize <= (size_t)(oend - segmentEnd))
                segmentEnd += segmentSize;
            else
                segmentEnd = oend;
            FORWARD_IF_ERROR(HUF_initRemainingDStream(&bit, &args, i, segmentEnd), "corruption");
            /* Decompress and validate that we've produced exactly the expected length. */
            args.op[i] += HUF_decodeStreamX1(args.op[i], &bit, segmentEnd, (HUF_DEltX1 const*)dt, HUF_DECODER_FAST_TABLELOG);
            if (args.op[i] != segmentEnd) return ERROR(corruption_detected);
        }
    }

    /* decoded size */
    assert(dstSize != 0);
    return dstSize;
}